

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.hpp
# Opt level: O0

void __thiscall helics::FederateState::spinlock(FederateState *this)

{
  __atomic_flag_data_type _Var1;
  FederateState *this_local;
  
  do {
    LOCK();
    _Var1 = (this->processing).super___atomic_flag_base._M_i;
    (this->processing).super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var1 != false);
  return;
}

Assistant:

void spinlock() const
    {
        while (processing.test_and_set()) {
            ;  // spin
        }
    }